

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O0

QAccessibleInterface * __thiscall QAccessibleMenu::parent(QAccessibleMenu *this)

{
  bool bVar1;
  const_iterator o;
  QMenu *pQVar2;
  QMenuBar *pQVar3;
  qsizetype qVar4;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidget *widget;
  QObject *object;
  add_const_t<QList<QObject_*>_> *__range2;
  const_iterator __end2;
  const_iterator __begin2;
  QList<QObject_*> associatedObjects;
  QList<QObject_*> parentCandidates;
  QAction *menuAction;
  parameter_type in_stack_ffffffffffffff48;
  QListSpecialMethodsBase<QAction_*> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int iVar5;
  QList<QObject_*> *in_stack_ffffffffffffff78;
  QAccessibleInterface *local_78;
  const_iterator in_stack_ffffffffffffffb8;
  QList<QObject_*> local_40;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  QAction *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  menu((QAccessibleMenu *)0x7dad50);
  local_10 = QMenu::menuAction((QMenu *)0x7dad58);
  if (local_10 != (QAction *)0x0) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QObject_*>::QList((QList<QObject_*> *)0x7dada9);
    local_40.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_40.d.ptr = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
    local_40.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QAction::associatedObjects();
    QList<QObject_*>::size(&local_40);
    QList<QObject_*>::reserve(in_stack_ffffffffffffff78,(qsizetype)in_stack_ffffffffffffffb8.i);
    menu((QAccessibleMenu *)0x7dae0d);
    QWidget::parentWidget((QWidget *)0x7dae15);
    QList<QObject_*>::operator<<
              ((QList<QObject_*> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    QList<QObject_*>::operator<<
              ((QList<QObject_*> *)in_stack_ffffffffffffff50,
               (QList<QObject_*> *)in_stack_ffffffffffffff48);
    QList<QObject_*>::begin((QList<QObject_*> *)in_stack_ffffffffffffff50);
    o = QList<QObject_*>::end((QList<QObject_*> *)in_stack_ffffffffffffff50);
    while (bVar1 = QList<QObject_*>::const_iterator::operator!=
                             ((const_iterator *)&stack0xffffffffffffffb8,o), bVar1) {
      QList<QObject_*>::const_iterator::operator*((const_iterator *)&stack0xffffffffffffffb8);
      pQVar2 = qobject_cast<QMenu*>((QObject *)0x7daec2);
      if ((pQVar2 != (QMenu *)0x0) ||
         (pQVar3 = qobject_cast<QMenuBar*>((QObject *)0x7daed2), pQVar3 != (QMenuBar *)0x0)) {
        QWidget::actions(in_RDI);
        qVar4 = QListSpecialMethodsBase<QAction*>::indexOf<QAction*>
                          (in_stack_ffffffffffffff50,(QAction **)in_stack_ffffffffffffff48,0x7daf07)
        ;
        QList<QAction_*>::~QList((QList<QAction_*> *)0x7daf16);
        if (qVar4 != -1) {
          local_78 = getOrCreateMenu((QWidget *)
                                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                     (QAction *)in_RDI);
          iVar5 = 1;
          goto LAB_007daf5d;
        }
        in_stack_ffffffffffffff50 = (QListSpecialMethodsBase<QAction_*> *)0xffffffffffffffff;
      }
      QList<QObject_*>::const_iterator::operator++((const_iterator *)&stack0xffffffffffffffb8);
    }
    iVar5 = 0;
LAB_007daf5d:
    QList<QObject_*>::~QList((QList<QObject_*> *)0x7daf67);
    QList<QObject_*>::~QList((QList<QObject_*> *)0x7daf74);
    if (iVar5 != 0) goto LAB_007daf91;
  }
  local_78 = QAccessibleWidget::parent((QAccessibleWidget *)0x7daf8c);
LAB_007daf91:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_78;
}

Assistant:

QAccessibleInterface *QAccessibleMenu::parent() const
{
    if (QAction *menuAction = menu()->menuAction()) {
        QList<QObject *> parentCandidates;
        const QList<QObject *> associatedObjects = menuAction->associatedObjects();
        parentCandidates.reserve(associatedObjects.size() + 1);
        parentCandidates << menu()->parentWidget() << associatedObjects;
        for (QObject *object : std::as_const(parentCandidates)) {
            if (qobject_cast<QMenu*>(object)
#if QT_CONFIG(menubar)
                || qobject_cast<QMenuBar*>(object)
#endif
                ) {
                QWidget *widget = static_cast<QWidget*>(object);
                if (widget->actions().indexOf(menuAction) != -1)
                    return getOrCreateMenu(widget, menuAction);
            }
        }
    }
    return QAccessibleWidget::parent();
}